

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_font_atlas_init_custom(nk_font_atlas *atlas,nk_allocator *permanent,nk_allocator *temporary)

{
  nk_plugin_alloc p_Var1;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2f51,
                  "void nk_font_atlas_init_custom(struct nk_font_atlas *, struct nk_allocator *, struct nk_allocator *)"
                 );
  }
  if (permanent != (nk_allocator *)0x0) {
    if (temporary != (nk_allocator *)0x0) {
      nk_zero(atlas,400);
      (atlas->permanent).free = permanent->free;
      p_Var1 = permanent->alloc;
      (atlas->permanent).userdata = permanent->userdata;
      (atlas->permanent).alloc = p_Var1;
      p_Var1 = temporary->alloc;
      (atlas->temporary).userdata = temporary->userdata;
      (atlas->temporary).alloc = p_Var1;
      (atlas->temporary).free = temporary->free;
      return;
    }
    __assert_fail("temporary",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2f53,
                  "void nk_font_atlas_init_custom(struct nk_font_atlas *, struct nk_allocator *, struct nk_allocator *)"
                 );
  }
  __assert_fail("permanent",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x2f52,
                "void nk_font_atlas_init_custom(struct nk_font_atlas *, struct nk_allocator *, struct nk_allocator *)"
               );
}

Assistant:

NK_API void
nk_font_atlas_init_custom(struct nk_font_atlas *atlas,
    struct nk_allocator *permanent, struct nk_allocator *temporary)
{
    NK_ASSERT(atlas);
    NK_ASSERT(permanent);
    NK_ASSERT(temporary);
    if (!atlas || !permanent || !temporary) return;
    nk_zero_struct(*atlas);
    atlas->permanent = *permanent;
    atlas->temporary = *temporary;
}